

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O0

Var Js::WebAssemblyInstance::CreateExportObject
              (WebAssemblyModule *wasmModule,ScriptContext *scriptContext,
              WebAssemblyEnvironment *env)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  WasmType WVar5;
  PropertyId propertyId;
  JavascriptLibrary *pJVar6;
  JavascriptLibrary *this;
  RecyclableObject *prototype;
  undefined4 *puVar7;
  WasmGlobal *this_00;
  ScriptContext *pSVar8;
  DynamicObject *pDVar9;
  WasmConstLitNode WVar10;
  double local_78;
  WasmConstLitNode cnst;
  WasmGlobal *global;
  Var obj;
  PropertyRecord *propertyRecord;
  WasmExport *wasmExport;
  DynamicObject *pDStack_40;
  uint32 iExport;
  Var exportsNamespace;
  WebAssemblyEnvironment *env_local;
  ScriptContext *scriptContext_local;
  WebAssemblyModule *wasmModule_local;
  float local_14;
  WasmGlobal *local_10;
  
  exportsNamespace = env;
  env_local = (WebAssemblyEnvironment *)scriptContext;
  scriptContext_local = (ScriptContext *)wasmModule;
  pJVar6 = ScriptContext::GetLibrary(scriptContext);
  this = ScriptContext::GetLibrary((ScriptContext *)env_local);
  prototype = JavascriptLibraryBase::GetNull(&this->super_JavascriptLibraryBase);
  pDStack_40 = JavascriptLibrary::CreateObject(pJVar6,prototype,0);
  wasmExport._4_4_ = 0;
  do {
    uVar2 = wasmExport._4_4_;
    uVar4 = WebAssemblyModule::GetExportCount((WebAssemblyModule *)scriptContext_local);
    if (uVar4 <= uVar2) {
      pDVar9 = VarTo<Js::DynamicObject>(pDStack_40);
      (*(pDVar9->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x35])();
      return pDStack_40;
    }
    propertyRecord =
         (PropertyRecord *)
         WebAssemblyModule::GetExport((WebAssemblyModule *)scriptContext_local,wasmExport._4_4_);
    if (propertyRecord == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                                  ,0xd7,"(wasmExport)","wasmExport");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (propertyRecord != (PropertyRecord *)0x0) {
      obj = (Var)0x0;
      ScriptContext::GetOrAddPropertyRecord
                ((ScriptContext *)env_local,*(LPCWSTR *)&propertyRecord->pid,
                 *(int *)((long)&(propertyRecord->super_FinalizableObject).
                                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4),
                 (PropertyRecord **)&obj);
      pJVar6 = ScriptContext::GetLibrary((ScriptContext *)env_local);
      global = (WasmGlobal *)
               JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
      switch(propertyRecord->isNumeric) {
      case false:
        global = (WasmGlobal *)
                 WebAssemblyEnvironment::GetWasmFunction
                           ((WebAssemblyEnvironment *)exportsNamespace,
                            *(uint32 *)
                             &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject
                              ._vptr_IRecyclerVisitedObject);
        break;
      case true:
        global = (WasmGlobal *)
                 WebAssemblyEnvironment::GetTable
                           ((WebAssemblyEnvironment *)exportsNamespace,
                            *(uint32 *)
                             &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject
                              ._vptr_IRecyclerVisitedObject);
        break;
      case true:
        global = (WasmGlobal *)
                 WebAssemblyEnvironment::GetMemory
                           ((WebAssemblyEnvironment *)exportsNamespace,
                            *(uint32 *)
                             &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject
                              ._vptr_IRecyclerVisitedObject);
        break;
      case true:
        this_00 = WebAssemblyModule::GetGlobal
                            ((WebAssemblyModule *)scriptContext_local,
                             *(uint32 *)
                              &(propertyRecord->super_FinalizableObject).
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject);
        bVar3 = Wasm::WasmGlobal::IsMutable(this_00);
        if (bVar3) {
          pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext_local);
          JavascriptError::ThrowTypeError(pSVar8,-0x7ff5e4a3,(PCWSTR)0x0);
        }
        WVar10 = WebAssemblyEnvironment::GetGlobalValue
                           ((WebAssemblyEnvironment *)exportsNamespace,this_00);
        WVar5 = Wasm::WasmGlobal::GetType(this_00);
        local_78._0_4_ = (float)WVar10.field_0.i32;
        switch(WVar5) {
        case FirstLocalType:
          local_14 = local_78._0_4_;
          wasmModule_local = (WebAssemblyModule *)env_local;
          bVar3 = TaggedInt::IsOverflow((int32)local_78._0_4_);
          if (bVar3) {
            local_10 = (WasmGlobal *)
                       JavascriptNumber::NewInlined
                                 ((double)(int)local_14,(ScriptContext *)wasmModule_local);
          }
          else {
            local_10 = (WasmGlobal *)TaggedInt::ToVarUnchecked((int)local_14);
          }
          global = local_10;
          break;
        case I64:
          pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext_local);
          JavascriptError::ThrowTypeErrorVar(pSVar8,-0x7ff5e49f,L"i64",L"Var");
        case F32:
          global = (WasmGlobal *)
                   JavascriptNumber::NewWithCheck((double)local_78._0_4_,(ScriptContext *)env_local)
          ;
          break;
        case F64:
          local_78 = WVar10.field_0.f64;
          global = (WasmGlobal *)JavascriptNumber::NewWithCheck(local_78,(ScriptContext *)env_local)
          ;
          break;
        case V128:
          pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext_local);
          JavascriptError::ThrowTypeErrorVar(pSVar8,-0x7ff5e49f,L"v128",L"Var");
        default:
          Wasm::WasmTypes::
          CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                    ();
        }
      }
      pDVar9 = pDStack_40;
      propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)obj);
      Js::JavascriptOperators::OP_SetProperty
                (pDVar9,propertyId,global,(ScriptContext *)env_local,(PropertyValueInfo *)0x0,
                 PropertyOperation_None,(Var)0x0);
    }
    wasmExport._4_4_ = wasmExport._4_4_ + 1;
  } while( true );
}

Assistant:

Var WebAssemblyInstance::CreateExportObject(WebAssemblyModule * wasmModule, ScriptContext* scriptContext, WebAssemblyEnvironment* env)
{
    Js::Var exportsNamespace = scriptContext->GetLibrary()->CreateObject(scriptContext->GetLibrary()->GetNull());
    for (uint32 iExport = 0; iExport < wasmModule->GetExportCount(); ++iExport)
    {
        Wasm::WasmExport* wasmExport = wasmModule->GetExport(iExport);
        Assert(wasmExport);
        if (wasmExport)
        {
            PropertyRecord const * propertyRecord = nullptr;
            scriptContext->GetOrAddPropertyRecord(wasmExport->name, wasmExport->nameLength, &propertyRecord);

            Var obj = scriptContext->GetLibrary()->GetUndefined();
            switch (wasmExport->kind)
            {
            case Wasm::ExternalKinds::Table:
                obj = env->GetTable(wasmExport->index);
                break;
            case Wasm::ExternalKinds::Memory:
                obj = env->GetMemory(wasmExport->index);
                break;
            case Wasm::ExternalKinds::Function:
                obj = env->GetWasmFunction(wasmExport->index);
                break;
            case Wasm::ExternalKinds::Global:
                Wasm::WasmGlobal* global = wasmModule->GetGlobal(wasmExport->index);
                if (global->IsMutable())
                {
                    JavascriptError::ThrowTypeError(wasmModule->GetScriptContext(), WASMERR_MutableGlobal);
                }
                Wasm::WasmConstLitNode cnst = env->GetGlobalValue(global);
                switch (global->GetType())
                {
                case Wasm::WasmTypes::I32:
                    obj = JavascriptNumber::ToVar(cnst.i32, scriptContext);
                    break;
                case Wasm::WasmTypes::I64:
                    JavascriptError::ThrowTypeErrorVar(wasmModule->GetScriptContext(), WASMERR_InvalidTypeConversion, _u("i64"), _u("Var"));
                case Wasm::WasmTypes::F32:
                    obj = JavascriptNumber::NewWithCheck(cnst.f32, scriptContext);
                    break;
                case Wasm::WasmTypes::F64:
                    obj = JavascriptNumber::NewWithCheck(cnst.f64, scriptContext);
                    break;
#ifdef ENABLE_WASM_SIMD
                case Wasm::WasmTypes::V128:
                    JavascriptError::ThrowTypeErrorVar(wasmModule->GetScriptContext(), WASMERR_InvalidTypeConversion, _u("v128"), _u("Var"));
#endif
                default:
                    Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                }
            }
            JavascriptOperators::OP_SetProperty(exportsNamespace, propertyRecord->GetPropertyId(), obj, scriptContext);
        }
    }
    VarTo<DynamicObject>(exportsNamespace)->PreventExtensions();
    return exportsNamespace;
}